

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_toreg_nobranch(FuncState *fs,ExpDesc *e,BCReg reg)

{
  uint uVar1;
  BCReg BVar2;
  int iVar3;
  uint32_t in_EDX;
  GCobj *in_RSI;
  FuncState *in_RDI;
  int32_t k;
  lua_Number n;
  BCIns ins;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  FuncState *fs_00;
  BCIns ins_00;
  
  ins_00 = (BCIns)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  expr_discharge((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if ((in_RSI->str).hash == 3) {
    uVar1 = in_EDX << 8 | 0x27;
    BVar2 = const_str((FuncState *)(CONCAT44(in_stack_ffffffffffffffd4,in_EDX << 8) | 0x27),
                      (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    uVar1 = uVar1 | BVar2 << 0x10;
  }
  else if ((in_RSI->str).hash == 4) {
    fs_00 = *(FuncState **)in_RSI;
    iVar3 = (int)(double)fs_00;
    if (((iVar3 != (short)iVar3) || ((double)fs_00 != (double)iVar3)) ||
       (NAN((double)fs_00) || NAN((double)iVar3))) {
      uVar1 = in_EDX << 8 | 0x2a;
      BVar2 = const_num(fs_00,(ExpDesc *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      uVar1 = uVar1 | BVar2 << 0x10;
    }
    else {
      uVar1 = in_EDX << 8 | 0x29 | iVar3 << 0x10;
    }
    ins_00 = (BCIns)((ulong)fs_00 >> 0x20);
  }
  else if ((in_RSI->str).hash == 5) {
    in_RDI->flags = in_RDI->flags | 4;
    uVar1 = in_EDX << 8 | 0x28;
    BVar2 = const_gc(in_RDI,in_RSI,in_EDX);
    uVar1 = uVar1 | BVar2 << 0x10;
  }
  else {
    if ((in_RSI->str).hash == 0xb) {
      *(char *)((long)&in_RDI->bcbase[(in_RSI->gch).nextgc.gcptr32].ins + 1) = (char)in_EDX;
      goto LAB_0014cdc8;
    }
    if ((in_RSI->str).hash == 0xc) {
      if (in_EDX == (in_RSI->gch).nextgc.gcptr32) goto LAB_0014cdc8;
      uVar1 = in_EDX << 8 | 0x12 | (in_RSI->gch).nextgc.gcptr32 << 0x10;
    }
    else {
      if ((in_RSI->str).hash == 0) {
        bcemit_nil(in_RDI,(BCReg)((ulong)in_RSI >> 0x20),(BCReg)in_RSI);
        goto LAB_0014cdc8;
      }
      if (2 < (in_RSI->str).hash) {
        return;
      }
      uVar1 = in_EDX << 8 | 0x2b | (in_RSI->str).hash << 0x10;
    }
  }
  bcemit_INS((FuncState *)CONCAT44(in_EDX,uVar1),ins_00);
LAB_0014cdc8:
  *(uint32_t *)in_RSI = in_EDX;
  (in_RSI->str).hash = 0xc;
  return;
}

Assistant:

static void expr_toreg_nobranch(FuncState *fs, ExpDesc *e, BCReg reg)
{
  BCIns ins;
  expr_discharge(fs, e);
  if (e->k == VKSTR) {
    ins = BCINS_AD(BC_KSTR, reg, const_str(fs, e));
  } else if (e->k == VKNUM) {
#if LJ_DUALNUM
    cTValue *tv = expr_numtv(e);
    if (tvisint(tv) && checki16(intV(tv)))
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)intV(tv));
    else
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checki16(k) && n == (lua_Number)k)
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)k);
    else
#endif
      ins = BCINS_AD(BC_KNUM, reg, const_num(fs, e));
#if LJ_HASFFI
  } else if (e->k == VKCDATA) {
    fs->flags |= PROTO_FFI;
    ins = BCINS_AD(BC_KCDATA, reg,
		   const_gc(fs, obj2gco(cdataV(&e->u.nval)), LJ_TCDATA));
#endif
  } else if (e->k == VRELOCABLE) {
    setbc_a(bcptr(fs, e), reg);
    goto noins;
  } else if (e->k == VNONRELOC) {
    if (reg == e->u.s.info)
      goto noins;
    ins = BCINS_AD(BC_MOV, reg, e->u.s.info);
  } else if (e->k == VKNIL) {
    bcemit_nil(fs, reg, 1);
    goto noins;
  } else if (e->k <= VKTRUE) {
    ins = BCINS_AD(BC_KPRI, reg, const_pri(e));
  } else {
    lj_assertFS(e->k == VVOID || e->k == VJMP, "bad expr type %d", e->k);
    return;
  }
  bcemit_INS(fs, ins);
noins:
  e->u.s.info = reg;
  e->k = VNONRELOC;
}